

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lock.cpp
# Opt level: O3

bool __thiscall Threading::FastLock::_Lock(FastLock *this,TimeOut *rcxTO)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  timeval now;
  timeval local_48;
  timeval local_38;
  
  if (rcxTO->duration == 0) {
    iVar2 = pthread_mutex_trylock((pthread_mutex_t *)this);
  }
  else {
    if (rcxTO->duration != 0xffffffff) {
      gettimeofday(&local_38,(__timezone_ptr_t)0x0);
      uVar3 = (ulong)(rcxTO->duration * 1000);
      lVar1 = local_38.tv_usec + uVar3;
      lVar4 = local_38.tv_usec + -1000000 + uVar3;
      if (lVar1 < 0xf4241) {
        lVar4 = lVar1;
      }
      while ((gettimeofday(&local_48,(__timezone_ptr_t)0x0),
             local_48.tv_sec < (long)((ulong)(1000000 < lVar1) + local_38.tv_sec) ||
             (local_48.tv_usec < lVar4))) {
        iVar2 = pthread_mutex_trylock((pthread_mutex_t *)this);
        if (iVar2 == 0) {
          return true;
        }
        sched_yield();
      }
      return false;
    }
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  }
  return iVar2 == 0;
}

Assistant:

bool Threading::FastLock::_Lock(const TimeOut & rcxTO) volatile
{
    if (rcxTO == Infinite)
    {
        // Either pthread_mutex_lock return EINVAL (not initialized), and then it is not going to change
        // as we are the initializer (simply returns false here)
        return pthread_mutex_lock((HMUTEX*)&mutex) == 0;
    }
    else if (rcxTO == InstantCheck)
    {
        return pthread_mutex_trylock((HMUTEX*)&mutex) == 0;
    }
    else
    {   // We need to pool here, sorry
        // Process the absolute time for timeout
        struct timeval tOut;
        gettimeofday(&tOut, NULL);
        tOut.tv_usec += (uint32)rcxTO * 1000;
        if (tOut.tv_usec > 1000000)
        { tOut.tv_sec ++; tOut.tv_usec -= 1000000;  }

        // First try to lock the mutex
        // Sadly, we must poll here
        int retval = -1;
        while (stillBefore(&tOut))
        {
            retval = pthread_mutex_trylock((HMUTEX*)&mutex);
            if (retval == 0) break;
            // We didn't get the mutex, so sleep a little (to avoid CPU intensive wait)
            sched_yield();
        }
        if (retval == 0)
        {   // We now have the mutex, so check the state
            return true;
        }
        return false;
    }
}